

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsystemtrayicon_x11.cpp
# Opt level: O3

void __thiscall QSystemTrayIconSys::resizeEvent(QSystemTrayIconSys *this,QResizeEvent *event)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long in_FS_OFFSET;
  QRect QVar4;
  QPoint local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QWidget::update((QWidget *)this);
  QWidget::resizeEvent((QWidget *)this,event);
  bVar1 = QBalloonTip::isBalloonVisible();
  if (bVar1) {
    QVar4 = globalGeometry(this);
    lVar3 = (long)QVar4.x2.m_i.m_i + (long)QVar4.x1.m_i.m_i;
    lVar2 = (QVar4._8_8_ >> 0x20) + (QVar4._0_8_ >> 0x20);
    local_20 = (QPoint)((ulong)(lVar3 - (lVar3 >> 0x3f)) >> 1 & 0xffffffff |
                       (lVar2 - (lVar2 >> 0x3f) & 0xfffffffffffffffeU) << 0x1f);
    QBalloonTip::updateBalloonPosition(&local_20);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSystemTrayIconSys::resizeEvent(QResizeEvent *event)
{
    update();
    QWidget::resizeEvent(event);
    if (QBalloonTip::isBalloonVisible())
        QBalloonTip::updateBalloonPosition(globalGeometry().center());
}